

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::weakref::weakref(weakref *this,handle obj,handle callback)

{
  PyObject *pPVar1;
  PyObject **ppPVar2;
  _object *ptr;
  long lVar3;
  undefined8 uVar4;
  object *in_RDI;
  error_already_set *in_stack_ffffffffffffffd0;
  handle local_20 [2];
  handle local_10;
  handle local_8;
  
  ppPVar2 = pybind11::handle::ptr(&local_8);
  pPVar1 = *ppPVar2;
  ppPVar2 = pybind11::handle::ptr(&local_10);
  ptr = (_object *)PyWeakref_NewRef(pPVar1,*ppPVar2);
  pybind11::handle::handle<_object_*,_0>(local_20,ptr);
  object::object(in_RDI,local_20[0].m_ptr);
  if ((in_RDI->super_handle).m_ptr != (PyObject *)0x0) {
    return;
  }
  lVar3 = PyErr_Occurred();
  if (lVar3 != 0) {
    uVar4 = __cxa_allocate_exception(0x18);
    error_already_set::error_already_set(in_stack_ffffffffffffffd0);
    __cxa_throw(uVar4,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pybind11_fail((char *)in_RDI);
}

Assistant:

explicit weakref(handle obj, handle callback = {})
        : object(PyWeakref_NewRef(obj.ptr(), callback.ptr()), stolen_t{}) {
        if (!m_ptr) {
            if (PyErr_Occurred()) {
                throw error_already_set();
            }
            pybind11_fail("Could not allocate weak reference!");
        }
    }